

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this)

{
  cmExtraCodeLiteGenerator *this_00;
  string local_48;
  cmExtraCodeLiteGenerator *local_18;
  cmExtraCodeLiteGenerator *p;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this_local;
  
  p = (cmExtraCodeLiteGenerator *)this;
  this_00 = (cmExtraCodeLiteGenerator *)operator_new(0x90);
  cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(this_00);
  local_18 = this_00;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_48,&this->super_cmExternalMakefileProjectGeneratorFactory);
  cmExternalMakefileProjectGenerator::SetName
            ((cmExternalMakefileProjectGenerator *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return &local_18->super_cmExternalMakefileProjectGenerator;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const CM_OVERRIDE
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }